

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::syntax::ProductionSyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::ProductionSyntax_*,_5UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::ProductionSyntax_*>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::ProductionSyntax_*>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::ProductionSyntax_*>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::ProductionSyntax_*>).cap = 5;
  SmallVectorBase<slang::syntax::ProductionSyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::ProductionSyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }